

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O2

void VP8InitBitReader(VP8BitReader *br,uint8_t *start,size_t size)

{
  uint8_t *puVar1;
  
  br->range_ = 0xfe;
  br->bits_ = -8;
  br->value_ = 0;
  br->eof_ = 0;
  br->buf_ = start;
  br->buf_end_ = start + size;
  puVar1 = start + (size - 7);
  if (size < 8) {
    puVar1 = start;
  }
  br->buf_max_ = puVar1;
  VP8LoadNewBytes(br);
  return;
}

Assistant:

void VP8InitBitReader(VP8BitReader* const br,
                      const uint8_t* const start, size_t size) {
  assert(br != NULL);
  assert(start != NULL);
  assert(size < (1u << 31));   // limit ensured by format and upstream checks
  br->range_   = 255 - 1;
  br->value_   = 0;
  br->bits_    = -8;   // to load the very first 8bits
  br->eof_     = 0;
  VP8BitReaderSetBuffer(br, start, size);
  VP8LoadNewBytes(br);
}